

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

SiameseResult __thiscall
siamese::Encoder::GenerateCauchyPacket(Encoder *this,SiameseRecoveryPacket *packet)

{
  ostringstream *this_00;
  uint uVar1;
  EncoderSubwindow *pEVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  SiameseResult SVar5;
  uint8_t *puVar6;
  OutputWorker *this_01;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint8_t y_j;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong __n;
  uint local_1dc;
  undefined1 local_1b8 [392];
  
  uVar1 = (this->Window).LongestPacket;
  uVar15 = (this->Window).FirstUnremovedElement;
  uVar8 = uVar1 + 8;
  puVar6 = pktalloc::Allocator::Reallocate
                     (&this->TheAllocator,(this->RecoveryPacket).Data,uVar8,Uninitialized);
  (this->RecoveryPacket).Data = puVar6;
  if (puVar6 == (uint8_t *)0x0) {
    uVar8 = 0;
  }
  (this->RecoveryPacket).Bytes = uVar8;
  if (puVar6 == (uint8_t *)0x0) {
    (this->Window).EmergencyDisabled = true;
    SVar5 = Siamese_Disabled;
  }
  else {
    uVar8 = (this->Window).ColumnStart;
    uVar12 = (this->Window).Count - (this->Window).FirstUnremovedElement;
    uVar14 = uVar15 + uVar8;
    uVar8 = this->NextParityColumn - uVar8 & 0x3fffff;
    if (uVar15 < uVar8 && uVar8 < 0x200000) {
      uVar8 = this->NextCauchyRow;
      local_1dc = uVar8 + 1;
      uVar9 = local_1dc;
      if (0xbf < local_1dc) {
        uVar9 = 0;
      }
      this->NextCauchyRow = uVar9;
      uVar11 = uVar14 & 0x3f;
      pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
      uVar8 = uVar8 + 0x40;
      uVar9 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
      __n = (ulong)uVar9;
      gf256_mul_mem(puVar6,(pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,
                    GF256Ctx.GF256_INV_TABLE[uVar8 & 0xff ^ uVar11],uVar9);
      memset((this->RecoveryPacket).Data + __n,0,(ulong)(uVar1 - uVar9));
      uVar1 = (this->Window).Count;
      uVar15 = uVar15 + 1;
      if (uVar15 < uVar1) {
        uVar7 = __n;
        do {
          uVar11 = uVar11 + 1 & 0x3f;
          pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
          uVar9 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
          gf256_muladd_mem((this->RecoveryPacket).Data,
                           GF256Ctx.GF256_INV_TABLE[uVar11 ^ uVar8 & 0xff],
                           (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,uVar9);
          __n = (ulong)uVar9;
          if (uVar9 < (uint)uVar7) {
            __n = uVar7;
          }
          uVar15 = uVar15 + 1;
          uVar7 = __n;
        } while (uVar1 != uVar15);
      }
    }
    else {
      this->NextParityColumn = uVar14 + uVar12 & 0x3fffff;
      pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
      uVar8 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
      __n = (ulong)uVar8;
      memcpy(puVar6,(pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,__n);
      local_1dc = 0;
      memset((this->RecoveryPacket).Data + __n,0,(ulong)(uVar1 - uVar8));
      uVar8 = (this->Window).Count;
      uVar15 = uVar15 + 1;
      uVar7 = __n;
      if (uVar15 < uVar8) {
        do {
          pEVar2 = (this->Window).Subwindows.DataPtr[uVar15 >> 6];
          uVar1 = (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Bytes;
          gf256_add_mem((this->RecoveryPacket).Data,
                        (pEVar2->Originals)._M_elems[uVar15 & 0x3f].Buffer.Data,uVar1);
          __n = (ulong)uVar1;
          if (uVar1 < (uint)uVar7) {
            __n = uVar7;
          }
          uVar15 = uVar15 + 1;
          uVar7 = __n;
        } while (uVar8 != uVar15);
      }
    }
    puVar6 = (this->RecoveryPacket).Data + __n;
    uVar8 = 0;
    if (1 < uVar12) {
      *puVar6 = (uint8_t)local_1dc;
      puVar6[1] = (uint8_t)uVar12;
      uVar8 = 2;
      if (0x7f < uVar12) {
        puVar6[2] = (byte)(uVar12 >> 8) | 0x80;
        uVar8 = 3;
      }
    }
    uVar7 = (ulong)uVar8;
    if ((uVar14 & 0x3fffff) < 0x80) {
      puVar6[uVar7] = (uint8_t)uVar14;
      uVar8 = 1;
    }
    else {
      bVar4 = (byte)(uVar14 >> 8);
      puVar6[uVar7] = (uint8_t)uVar14;
      if ((uVar14 & 0x3fffff) < 0x4000) {
        puVar6[uVar7 + 1] = bVar4 | 0x80;
        uVar8 = 2;
      }
      else {
        puVar6[uVar7 + 1] = bVar4;
        puVar6[uVar7 + 2] = (byte)(uVar14 >> 0x10) | 0xc0;
        uVar8 = 3;
      }
    }
    lVar10 = uVar8 + uVar7;
    uVar12 = uVar12 - 1;
    puVar6[lVar10] = (uint8_t)uVar12;
    iVar13 = 1;
    if (0x7f < uVar12) {
      puVar6[lVar10 + 1] = (byte)(uVar12 >> 8) | 0x80;
      iVar13 = 2;
    }
    packet->Data = (this->RecoveryPacket).Data;
    packet->DataBytes = (int)__n + (int)lVar10 + iVar13;
    if (DAT_0020d7e8 < 3) {
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger;
      local_1b8._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,DAT_0020d818,DAT_0020d820);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Generated Cauchy/parity recovery packet start=",0x2e);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ldpcCount=",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," sumCount=",10);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," row=",5);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    auVar3 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar3 = vpinsrq_avx(auVar3,(ulong)packet->DataBytes,1);
    auVar3 = vpaddq_avx(auVar3,*(undefined1 (*) [16])((this->Stats).Counts + 2));
    *(undefined1 (*) [16])((this->Stats).Counts + 2) = auVar3;
    SVar5 = Siamese_Success;
  }
  return SVar5;
}

Assistant:

SiameseResult Encoder::GenerateCauchyPacket(SiameseRecoveryPacket& packet)
{
    // Reset recovery packet
    const unsigned firstElement  = Window.FirstUnremovedElement;
    const unsigned recoveryBytes = Window.LongestPacket;
    if (!RecoveryPacket.Initialize(&TheAllocator, recoveryBytes + kMaxRecoveryMetadataBytes))
    {
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }

    const unsigned unacknowledgedCount = Window.GetUnacknowledgedCount();
    RecoveryMetadata metadata;
    metadata.SumCount    = unacknowledgedCount;
    metadata.LDPCCount   = unacknowledgedCount;
    metadata.ColumnStart = Window.ElementToColumn(firstElement);

    // We have to recalculate the number of used bytes since the Cauchy/parity rows may be
    // shorter since they do not need to contain the start of the window which may be acked.
    unsigned usedBytes = 0;

    // If it is time to generate a new parity row:
    const unsigned nextParityElement = Window.ColumnToElement(NextParityColumn);
    if (nextParityElement <= firstElement || IsColumnDeltaNegative(nextParityElement))
    {
        // Set next time we write a parity row
        NextParityColumn = AddColumns(metadata.ColumnStart, unacknowledgedCount);

        // Row 0 is a parity row
        metadata.Row = 0;

        // Unroll first column
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        unsigned originalBytes   = original->Buffer.Bytes;

        memcpy(RecoveryPacket.Data, original->Buffer.Data, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_add_mem(RecoveryPacket.Data, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }
    else
    {
        // Select Cauchy row number
        const unsigned cauchyRow = NextCauchyRow;
        metadata.Row = cauchyRow + 1;
        if (++NextCauchyRow >= kCauchyMaxRows)
            NextCauchyRow = 0;

        // Unroll first column
        unsigned cauchyColumn    = metadata.ColumnStart % kCauchyMaxColumns;
        OriginalPacket* original = Window.GetWindowElement(firstElement);
        uint8_t y                = CauchyElement(cauchyRow, cauchyColumn);
        unsigned originalBytes   = original->Buffer.Bytes;

        gf256_mul_mem(RecoveryPacket.Data, original->Buffer.Data, y, originalBytes);
        // Pad the rest out with zeros to avoid corruption
        SIAMESE_DEBUG_ASSERT(recoveryBytes >= originalBytes);
        SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);
        memset(RecoveryPacket.Data + originalBytes, 0, recoveryBytes - originalBytes);

        usedBytes = originalBytes;

        // For each remaining column:
        for (unsigned element = firstElement + 1, count = Window.Count; element < count; ++element)
        {
            cauchyColumn  = (cauchyColumn + 1) % kCauchyMaxColumns;
            original      = Window.GetWindowElement(element);
            originalBytes = original->Buffer.Bytes;
            y             = CauchyElement(cauchyRow, cauchyColumn);

            SIAMESE_DEBUG_ASSERT(RecoveryPacket.Bytes >= originalBytes);

            gf256_muladd_mem(RecoveryPacket.Data, y, original->Buffer.Data, originalBytes);

            if (usedBytes < originalBytes)
                usedBytes = originalBytes;
        }
    }

    // Slap metadata footer on the end
    const unsigned footerBytes = SerializeFooter_RecoveryMetadata(metadata, RecoveryPacket.Data + usedBytes);

    packet.Data      = RecoveryPacket.Data;
    packet.DataBytes = usedBytes + footerBytes;

    Logger.Info("Generated Cauchy/parity recovery packet start=", metadata.ColumnStart, " ldpcCount=", metadata.LDPCCount, " sumCount=", metadata.SumCount, " row=", metadata.Row);

    Stats.Counts[SiameseEncoderStats_RecoveryCount]++;
    Stats.Counts[SiameseEncoderStats_RecoveryBytes] += packet.DataBytes;

    return Siamese_Success;
}